

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t row_offset)

{
  idx_t row_idx;
  ulong uVar1;
  
  uVar1 = num_values + row_offset;
  for (; row_offset < uVar1; row_offset = row_offset + 1) {
    StringParquetValueConversion::PlainSkip<true>(plain_data,this);
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}